

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float fVar1;
  ImVec2 pos_00;
  ImVec2 IVar2;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  char *text;
  bool bVar4;
  bool bVar5;
  ImGuiID IVar6;
  ImU32 IVar7;
  ImU32 col;
  uint uVar8;
  ImGuiWindow *pIVar9;
  ImGuiContext *g;
  ImDrawCornerFlags rounding_corners;
  uint uVar10;
  float fVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  bool hovered;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImRect r_outer;
  ImVec2 size_expected;
  ImVec2 pos;
  ImRect total_bb;
  bool local_101;
  float local_100;
  bool local_f9;
  ImRect local_f8;
  ImGuiID local_dc;
  ImVec2 local_d8 [2];
  undefined1 local_c8 [16];
  uint local_b4;
  char *local_b0;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  ImRect local_98;
  undefined1 local_88 [24];
  char *local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined1 local_58 [16];
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar3 = GImGui;
  uVar10 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar10 & 0xffffffef;
  pIVar9 = pIVar3->CurrentWindow;
  pIVar9->WriteAccessed = true;
  if (pIVar9->SkipItems != false) {
    return false;
  }
  local_b0 = preview_value;
  IVar6 = ImGuiWindow::GetID(pIVar9,label,(char *)0x0);
  local_100 = 0.0;
  if ((flags & 0x20U) == 0) {
    local_100 = GetFrameHeight();
  }
  IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_88._8_4_ = extraout_XMM0_Dc;
  local_88._0_4_ = IVar2.x;
  local_88._4_4_ = IVar2.y;
  local_88._12_4_ = extraout_XMM0_Dd;
  fVar11 = CalcItemWidth();
  uStack_a4 = 0;
  uStack_a0 = 0;
  uStack_9c = 0;
  local_a8 = local_100;
  if ((flags & 0x40U) == 0) {
    local_a8 = fVar11;
    uStack_a4 = extraout_XMM0_Db;
    uStack_a0 = extraout_XMM0_Dc_00;
    uStack_9c = extraout_XMM0_Dd_00;
  }
  fVar11 = (pIVar3->Style).FramePadding.y;
  IVar2 = (pIVar9->DC).CursorPos;
  local_f8.Max.x = IVar2.x;
  local_f8.Min.x = local_f8.Max.x + 1.0;
  local_f8.Max.y = IVar2.y;
  local_f8.Min.y = local_f8.Max.y + 0.0;
  local_f8.Max.x = local_a8 + local_f8.Max.x;
  local_f8.Max.y = fVar11 + fVar11 + (float)local_88._4_4_ + local_f8.Max.y;
  local_40.Max.x = 0.0;
  if (0.0 < (float)local_88._0_4_) {
    local_40.Max.x = (pIVar3->Style).ItemInnerSpacing.x + (float)local_88._0_4_;
  }
  local_40.Max.x = local_40.Max.x + local_f8.Max.x;
  local_40.Max.y = local_f8.Max.y + 0.0;
  local_dc = IVar6;
  local_b4 = uVar10;
  local_70 = label;
  local_40.Min.x = local_f8.Min.x;
  local_40.Min.y = local_f8.Min.y;
  ItemSize(&local_40,fVar11);
  IVar6 = local_dc;
  bVar4 = ItemAdd(&local_40,local_dc,&local_f8);
  if (!bVar4) {
    return false;
  }
  bVar4 = ButtonBehavior(&local_f8,IVar6,&local_101,&local_f9,0);
  bVar5 = IsPopupOpen(IVar6,0);
  IVar7 = GetColorU32(local_101 + 7,1.0);
  local_c8 = ZEXT416((uint)local_f8.Min.x);
  local_58 = ZEXT416((uint)local_f8.Max.x);
  RenderNavHighlight(&local_f8,IVar6,1);
  uVar10 = -(uint)((float)local_58._0_4_ - local_100 <= (float)local_c8._0_4_);
  local_c8._0_4_ = uVar10 & local_c8._0_4_ | ~uVar10 & (uint)((float)local_58._0_4_ - local_100);
  local_c8._4_4_ = local_58._4_4_ & local_c8._4_4_;
  local_c8._8_4_ = local_58._8_4_ & local_c8._8_4_;
  local_c8._12_4_ = local_58._12_4_ & local_c8._12_4_;
  if ((flags & 0x40U) == 0) {
    local_d8[0].y = local_f8.Min.y;
    local_d8[0].x = (float)local_c8._0_4_ + 1.0;
    rounding_corners = 0xf;
    if ((flags & 0x20U) == 0) {
      rounding_corners = 5;
    }
    ImDrawList::AddRectFilled
              (pIVar9->DrawList,&local_f8.Min,local_d8,IVar7,(pIVar3->Style).FrameRounding,
               rounding_corners);
  }
  text = local_70;
  if ((flags & 0x20U) == 0) {
    IVar7 = GetColorU32(((byte)(local_101 | bVar5) & 1) + 0x15,1.0);
    col = GetColorU32(0,1.0);
    local_d8[0].y = local_f8.Min.y;
    local_d8[0].x = (float)local_c8._0_4_ + 1.0;
    local_98.Min.y = local_f8.Min.y;
    local_98.Min.x = local_f8.Max.x;
    ImDrawList::AddRectFilled
              (pIVar9->DrawList,local_d8,&local_98.Min,IVar7,(pIVar3->Style).FrameRounding,
               (uint)(local_a8 <= local_100) * 5 + 10);
    if ((local_100 + (float)local_c8._0_4_) - (pIVar3->Style).FramePadding.x <= local_f8.Max.x) {
      fVar11 = (pIVar3->Style).FramePadding.y;
      IVar2.y = fVar11 + local_f8.Min.y;
      IVar2.x = fVar11 + (float)local_c8._0_4_;
      RenderArrow(pIVar9->DrawList,IVar2,col,3,1.0);
    }
  }
  p_min.y = local_f8.Min.y;
  p_min.x = local_f8.Min.x;
  p_max.y = local_f8.Max.y;
  p_max.x = local_f8.Max.x;
  RenderFrameBorder(p_min,p_max,(pIVar3->Style).FrameRounding);
  IVar6 = local_dc;
  if (local_b0 != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
    IVar2 = (pIVar3->Style).FramePadding;
    local_d8[0].x = IVar2.x + local_f8.Min.x;
    local_d8[0].y = IVar2.y + local_f8.Min.y;
    if (pIVar3->LogEnabled == true) {
      LogSetNextTextDecoration("{","}");
    }
    local_98.Min.y = local_f8.Max.y;
    local_98.Min.x = (float)local_c8._0_4_;
    local_60.x = 0.0;
    local_60.y = 0.0;
    RenderTextClipped(local_d8,&local_98.Min,local_b0,(char *)0x0,(ImVec2 *)0x0,&local_60,
                      (ImRect *)0x0);
  }
  if (0.0 < (float)local_88._0_4_) {
    pos_00.y = (pIVar3->Style).FramePadding.y + local_f8.Min.y;
    pos_00.x = (pIVar3->Style).ItemInnerSpacing.x + local_f8.Max.x;
    RenderText(pos_00,text,(char *)0x0,true);
  }
  if (bVar4) {
    if (bVar5) goto LAB_0015f8a7;
  }
  else if (pIVar3->NavActivateId != IVar6 || bVar5) {
    if (!bVar5) {
      return false;
    }
    goto LAB_0015f8a7;
  }
  if ((pIVar9->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
    pIVar9->NavLastIds[0] = IVar6;
  }
  OpenPopupEx(IVar6,0);
LAB_0015f8a7:
  if ((local_b4 & 0x10) == 0) {
    uVar10 = flags | 4;
    if ((flags & 0x1eU) != 0) {
      uVar10 = flags;
    }
    uVar8 = 8;
    if (((uVar10 & 4) == 0) && (uVar8 = 4, (uVar10 & 2) == 0)) {
      uVar8 = -(uint)((uVar10 & 8) == 0) | 0x14;
    }
    local_d8[0].y = 0.0;
    local_d8[0].x = local_a8;
    if ((int)uVar8 < 1) {
      fVar11 = 3.4028235e+38;
    }
    else {
      fVar11 = (GImGui->Style).WindowPadding.y;
      fVar1 = (GImGui->Style).ItemSpacing.y;
      fVar11 = fVar11 + fVar11 + ((float)(int)uVar8 * (GImGui->FontSize + fVar1) - fVar1);
    }
    local_98.Min.y = fVar11;
    local_98.Min.x = 3.4028235e+38;
    SetNextWindowSizeConstraints(local_d8,&local_98.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
    flags = uVar10;
  }
  else {
    *(byte *)&(pIVar3->NextWindowData).Flags = (byte)(pIVar3->NextWindowData).Flags | 0x10;
    fVar11 = (pIVar3->NextWindowData).SizeConstraintRect.Min.x;
    uVar10 = -(uint)(local_a8 <= fVar11);
    (pIVar3->NextWindowData).SizeConstraintRect.Min.x =
         (float)(~uVar10 & (uint)local_a8 | (uint)fVar11 & uVar10);
  }
  ImFormatString((char *)local_d8,0x10,"##Combo_%02d",(ulong)(uint)(pIVar3->BeginPopupStack).Size);
  pIVar9 = FindWindowByName((char *)local_d8);
  if ((pIVar9 != (ImGuiWindow *)0x0) && (pIVar9->WasActive == true)) {
    local_60 = CalcWindowNextAutoFitSize(pIVar9);
    pIVar9->AutoPosLastDirection = (uint)((flags & 1U) == 0) * 3;
    local_98 = GetWindowAllowedExtentRect(pIVar9);
    local_68.y = local_f8.Max.y;
    local_68.x = local_f8.Min.x;
    local_48 = FindBestWindowPosForPopupEx
                         (&local_68,&local_60,&pIVar9->AutoPosLastDirection,&local_98,&local_f8,
                          ImGuiPopupPositionPolicy_ComboBox);
    local_68.x = 0.0;
    local_68.y = 0.0;
    SetNextWindowPos(&local_48,0,&local_68);
  }
  local_98.Min.y = (pIVar3->Style).WindowPadding.y;
  local_98.Min.x = (pIVar3->Style).FramePadding.x;
  PushStyleVar(1,&local_98.Min);
  bVar4 = Begin((char *)local_d8,(bool *)0x0,0x4000147);
  PopStyleVar(1);
  if (!bVar4) {
    EndPopup();
    return bVar4;
  }
  return bVar4;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    bool has_window_size_constraint = (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint) != 0;
    g.NextWindowData.Flags &= ~ImGuiNextWindowDataFlags_HasSizeConstraint;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = CalcItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos + ImVec2(1.0f, 0.0f), window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id, ImGuiPopupFlags_None);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2 + 1.0f, frame_bb.Min.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2 + 1.0f, frame_bb.Min.y), ImVec2(frame_bb.Max.x, frame_bb.Min.y), bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        if (value_x2 + arrow_size - style.FramePadding.x <= frame_bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
    {
        ImVec2 preview_pos = frame_bb.Min + style.FramePadding;
        if (g.LogEnabled)
            LogSetNextTextDecoration("{", "}");
        RenderTextClipped(preview_pos, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f, 0.0f));
    }
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id, ImGuiPopupFlags_None);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (has_window_size_constraint)
    {
        g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSizeConstraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Position the window given a custom constraint (peak into expected window size so we can position it)
    // This might be easier to express with an hypothetical SetNextWindowPosConstraints() function.
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            // Always override 'AutoPosLastDirection' to not leave a chance for a past value to affect us.
            ImVec2 size_expected = CalcWindowNextAutoFitSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left; // "Below, Toward Left"
            else
                popup_window->AutoPosLastDirection = ImGuiDir_Down; // "Below, Toward Right (default)"
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;

    // Horizontally align ourselves with the framed text
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}